

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CheckRPath(string *file,string *newRPath)

{
  bool bVar1;
  StringEntry *pSVar2;
  size_type sVar3;
  cmELF elf;
  cmELF cStack_58;
  string_view local_30;
  string_view local_20;
  
  cmELF::cmELF(&cStack_58,(file->_M_dataplus)._M_p);
  bVar1 = cmELF::Valid(&cStack_58);
  if (bVar1) {
    pSVar2 = cmELF::GetRPath(&cStack_58);
    if (pSVar2 == (StringEntry *)0x0) {
      pSVar2 = cmELF::GetRunPath(&cStack_58);
    }
    if (newRPath->_M_string_length == 0) {
      if (pSVar2 == (StringEntry *)0x0) {
        bVar1 = true;
        goto LAB_00116e75;
      }
    }
    else if (pSVar2 != (StringEntry *)0x0) {
      local_20._M_str = (pSVar2->Value)._M_dataplus._M_p;
      local_20._M_len = (pSVar2->Value)._M_string_length;
      local_30._M_str = (newRPath->_M_dataplus)._M_p;
      local_30._M_len = newRPath->_M_string_length;
      sVar3 = cmSystemToolsFindRPath(&local_20,&local_30);
      bVar1 = true;
      if (sVar3 != 0xffffffffffffffff) goto LAB_00116e75;
    }
    bVar1 = false;
  }
  else {
    bVar1 = newRPath->_M_string_length == 0;
  }
LAB_00116e75:
  cmELF::~cmELF(&cStack_58);
  return bVar1;
}

Assistant:

bool cmSystemTools::CheckRPath(std::string const& file,
                               std::string const& newRPath)
{
  // Parse the ELF binary.
  cmELF elf(file.c_str());
  if (elf) {
    // Get the RPATH or RUNPATH entry from it.
    cmELF::StringEntry const* se = elf.GetRPath();
    if (!se) {
      se = elf.GetRunPath();
    }

    // Make sure the current rpath contains the new rpath.
    if (newRPath.empty()) {
      if (!se) {
        return true;
      }
    } else {
      if (se &&
          cmSystemToolsFindRPath(se->Value, newRPath) != std::string::npos) {
        return true;
      }
    }
    return false;
  }
#if defined(CMake_USE_XCOFF_PARSER)
  // Parse the XCOFF binary.
  cmXCOFF xcoff(file.c_str());
  if (xcoff) {
    if (cm::optional<cm::string_view> libPath = xcoff.GetLibPath()) {
      if (cmSystemToolsFindRPath(*libPath, newRPath) != std::string::npos) {
        return true;
      }
    }
    return false;
  }
#endif
  // The file format is not recognized.  Assume it has no RPATH.
  // Therefore we succeed if the new rpath is empty anyway.
  return newRPath.empty();
}